

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O1

void __thiscall
jsoncons::jsonschema::
dependent_schemas_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
::do_validate(dependent_schemas_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
              *this)

{
  json_pointer *in_RCX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDX;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *in_RSI;
  evaluation_results *in_R8;
  error_reporter *in_R9;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000008;
  
  dependent_schemas_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  ::do_validate((dependent_schemas_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)(this + *(long *)(*(long *)this + -0x38)),in_RSI,in_RDX,in_RCX,in_R8,in_R9,
                in_stack_00000008);
  return;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& results, 
            error_reporter& reporter, 
            Json& patch) const final
        {
            if (!instance.is_object())
            {
                return walk_result::advance;
            }

            eval_context<Json> this_context(context, this->keyword_name());

            for (const auto& dep : dependent_schemas_) 
            {
                auto prop = instance.find(dep.first);
                if (prop != instance.object_range().end()) 
                {
                    // if dependency-prop is present in instance
                    jsonpointer::json_pointer prop_location = instance_location / dep.first;
                    walk_result result = dep.second->validate(this_context, instance, prop_location, results, reporter, patch); // validate
                    if (result == walk_result::abort)
                    {
                        return result;
                    }
                }
            }
            return walk_result::advance;
        }